

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test::TestBody
          (CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test *this)

{
  bool bVar1;
  bool *searched_bnb;
  char *pcVar2;
  char *in_R9;
  Amount AVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  bool **in_stack_fffffffffffffd68;
  AssertionResult *in_stack_fffffffffffffd70;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd78;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  string local_230;
  AssertHelper local_210;
  Message local_208;
  byte local_1f9;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  int64_t local_1d0;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  int64_t local_1a0;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  size_type local_170;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150 [3];
  char local_138 [128];
  CoinSelectionOption *in_stack_ffffffffffffff48;
  UtxoFilter *in_stack_ffffffffffffff50;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  CoinSelection *in_stack_ffffffffffffff68;
  ConstCharPtr local_90 [2];
  Amount *in_stack_ffffffffffffff80;
  Amount *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar4;
  bool *local_58;
  undefined1 local_50;
  undefined1 local_48 [32];
  int64_t local_28;
  undefined1 local_20;
  int64_t local_18;
  undefined1 local_10;
  
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x25402d4);
  local_28 = AVar3.amount_;
  local_20 = AVar3.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount((Amount *)(local_48 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_48);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  searched_bnb = (bool *)AVar3.amount_;
  local_50 = AVar3.ignore_check_;
  bVar4 = 0;
  local_58 = searched_bnb;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27d23c);
  testing::internal::ConstCharPtr::ConstCharPtr(local_90,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_90);
  if (bVar1) {
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 & 0xffffff;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetElementsUtxoList();
      GetBitcoinOption();
      in_stack_fffffffffffffd80 =
           (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff97;
      in_stack_fffffffffffffd78 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_48;
      in_stack_fffffffffffffd70 = (AssertionResult *)(local_48 + 0x10);
      in_stack_fffffffffffffd68 = &local_58;
      in_R9 = local_138;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff68,
                 (Amount *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                 (Amount *)CONCAT17(bVar4,in_stack_ffffffffffffff90),searched_bnb);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
      cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27d346);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
    }
    if ((in_stack_ffffffffffffff60 & 0x1000000) != 0) goto LAB_0027d508;
    local_90[0].value =
         "Expected: ret = exp_selection.SelectCoins( target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
             ,0x611,local_90[0].value);
  testing::internal::AssertHelper::operator=(&local_158,local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::Message::~Message((Message *)0x27d4bd);
LAB_0027d508:
  local_170 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_90 + 1));
  local_174 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(unsigned_long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x27d5ac);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x613,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message((Message *)0x27d609);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d661);
  local_1a0 = cfd::core::Amount::GetSatoshiValue((Amount *)(local_48 + 0x10));
  local_1a4 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x27d723);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x614,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message((Message *)0x27d780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d7d8);
  local_1d0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_48);
  local_1d4 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x27d89a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x615,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message((Message *)0x27d8f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d94c);
  local_1f9 = ~bVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd70,(bool *)in_stack_fffffffffffffd68,(type *)0x27d977);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_230,(internal *)&local_1f8,(AssertionResult *)"use_bnb","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x616,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    testing::Message::~Message((Message *)0x27da66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27dadb);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(39060180);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}